

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

input_options * parse_source(input_options *__return_storage_ptr__,vw *all,options_i *options)

{
  string *location;
  bool *location_00;
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  option_group_definition *poVar7;
  options_boost_po *this;
  vw_exception *this_00;
  ulong uVar8;
  byte bVar9;
  vw_ostream *pvVar10;
  option_group_definition input_options;
  string data;
  string local_e30;
  undefined1 *local_e10 [2];
  undefined1 local_e00 [16];
  undefined1 *local_df0 [2];
  undefined1 local_de0 [16];
  string local_dd0;
  undefined1 *local_db0 [2];
  undefined1 local_da0 [16];
  string local_d90;
  undefined1 *local_d70 [2];
  undefined1 local_d60 [16];
  string local_d50;
  undefined1 *local_d30 [2];
  undefined1 local_d20 [16];
  string local_d10;
  undefined1 *local_cf0 [2];
  undefined1 local_ce0 [16];
  undefined1 *local_cd0 [2];
  undefined1 local_cc0 [16];
  string local_cb0;
  undefined1 *local_c90 [2];
  undefined1 local_c80 [16];
  string local_c70;
  undefined1 *local_c50 [2];
  undefined1 local_c40 [16];
  string local_c30;
  undefined1 *local_c10 [2];
  undefined1 local_c00 [16];
  string local_bf0;
  undefined1 *local_bd0 [2];
  undefined1 local_bc0 [16];
  string local_bb0;
  undefined1 *local_b90 [2];
  undefined1 local_b80 [16];
  string local_b70;
  undefined1 *local_b50 [2];
  undefined1 local_b40 [16];
  string local_b30;
  undefined1 *local_b10 [2];
  undefined1 local_b00 [16];
  undefined1 *local_af0 [2];
  undefined1 local_ae0 [16];
  string local_ad0;
  undefined1 *local_ab0;
  long local_aa8;
  undefined1 local_aa0 [16];
  option_group_definition local_a90;
  undefined1 *local_a58 [2];
  undefined1 local_a48 [16];
  string local_a38;
  undefined1 *local_a18 [2];
  undefined1 local_a08 [16];
  undefined1 local_9f8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_970;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_960;
  undefined1 local_958 [16];
  undefined1 local_948 [64];
  string local_908 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8c0;
  string local_7d0;
  undefined1 local_7b0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_728;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_718;
  undefined1 local_710 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_688;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_678;
  undefined1 local_670 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5d8;
  undefined1 local_5d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_538;
  undefined1 local_530 [80];
  string local_4e0 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  undefined1 local_490 [80];
  string local_440 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  undefined1 local_3f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  undefined1 local_2b0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_210 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined1 local_170 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  (__return_storage_ptr__->pid_file)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pid_file).field_2;
  (__return_storage_ptr__->pid_file)._M_string_length = 0;
  (__return_storage_ptr__->pid_file).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->port_file)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->port_file).field_2;
  (__return_storage_ptr__->port_file)._M_string_length = 0;
  (__return_storage_ptr__->port_file).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ab0 = local_aa0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab0,"Input options","");
  local_a90.m_name._M_dataplus._M_p = (pointer)&local_a90.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a90,local_ab0,local_ab0 + local_aa8);
  local_a90.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a90.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a90.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_ab0 != local_aa0) {
    operator_delete(local_ab0);
  }
  local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"data","");
  location = &all->data_filename;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_958,&local_ad0,location);
  local_af0[0] = local_ae0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_af0,"d","");
  std::__cxx11::string::_M_assign(local_908);
  local_b10[0] = local_b00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b10,"Example set","");
  std::__cxx11::string::_M_assign((string *)(local_948 + 0x20));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (&local_a90,
                      (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_958);
  local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b30,"daemon","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_9f8,&local_b30,&__return_storage_ptr__->daemon);
  local_b50[0] = local_b40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b50,"persistent daemon mode on port 26542","");
  std::__cxx11::string::_M_assign((string *)(local_9f8 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_9f8);
  local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b70,"foreground","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5d0,&local_b70,&__return_storage_ptr__->foreground);
  local_b90[0] = local_b80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b90,"in persistent daemon mode, do not run in the background","");
  std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_5d0);
  local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb0,"port","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_670,&local_bb0,&__return_storage_ptr__->port);
  local_bd0[0] = local_bc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bd0,"port to listen on; use 0 to pick unused port","");
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar7,(typed_option<unsigned_long> *)local_670);
  local_bf0._M_dataplus._M_p = (pointer)&local_bf0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bf0,"num_children","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_710,&local_bf0,&all->num_children);
  local_c10[0] = local_c00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c10,"number of children for persistent daemon mode","");
  std::__cxx11::string::_M_assign((string *)(local_710 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar7,(typed_option<unsigned_long> *)local_710);
  local_c30._M_dataplus._M_p = (pointer)&local_c30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c30,"pid_file","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_7b0,&local_c30,&__return_storage_ptr__->pid_file);
  local_c50[0] = local_c40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c50,"Write pid file in persistent daemon mode","");
  std::__cxx11::string::_M_assign((string *)(local_7b0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar7,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_7b0);
  local_c70._M_dataplus._M_p = (pointer)&local_c70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c70,"port_file","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d0,&local_c70,&__return_storage_ptr__->port_file);
  local_c90[0] = local_c80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c90,"Write port used in persistent daemon mode","");
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar7,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_d0);
  local_cb0._M_dataplus._M_p = (pointer)&local_cb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb0,"cache","");
  location_00 = &__return_storage_ptr__->cache;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_490,&local_cb0,location_00);
  local_cd0[0] = local_cc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd0,"c","");
  std::__cxx11::string::_M_assign(local_440);
  local_cf0[0] = local_ce0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cf0,"Use a cache.  The default is <data>.cache","");
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_490);
  local_d10._M_dataplus._M_p = (pointer)&local_d10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d10,"cache_file","");
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_170,&local_d10,&__return_storage_ptr__->cache_files);
  local_d30[0] = local_d20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d30,"The location(s) of cache_file.","");
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar7 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (poVar7,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_170);
  local_d50._M_dataplus._M_p = (pointer)&local_d50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d50,"json","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_210,&local_d50,&__return_storage_ptr__->json);
  local_d70[0] = local_d60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d70,"Enable JSON parsing.","");
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_210);
  local_d90._M_dataplus._M_p = (pointer)&local_d90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d90,"dsjson","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_d90,&__return_storage_ptr__->dsjson);
  local_db0[0] = local_da0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_db0,"Enable Decision Service JSON parsing.","");
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_2b0);
  local_dd0._M_dataplus._M_p = (pointer)&local_dd0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_dd0,"kill_cache","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_530,&local_dd0,&__return_storage_ptr__->kill_cache);
  local_df0[0] = local_de0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_df0,"k","");
  std::__cxx11::string::_M_assign(local_4e0);
  local_e10[0] = local_e00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e10,"do not reuse existing cache: create a new one always","");
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_530);
  local_e30._M_dataplus._M_p = (pointer)&local_e30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e30,"compressed","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_350,&local_e30,&__return_storage_ptr__->compressed);
  local_a18[0] = local_a08;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a18,
             "use gzip format whenever possible. If a cache file is being created, this option creates a compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."
             ,"");
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_350);
  local_a38._M_dataplus._M_p = (pointer)&local_a38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a38,"no_stdin","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3f0,&local_a38,&all->stdin_off);
  local_a58[0] = local_a48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a58,"do not default to reading from stdin","");
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar7,(typed_option<bool> *)local_3f0);
  if (local_a58[0] != local_a48) {
    operator_delete(local_a58[0]);
  }
  local_3f0._0_8_ = &PTR__typed_option_00306b28;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p);
  }
  if (local_a18[0] != local_a08) {
    operator_delete(local_a18[0]);
  }
  local_350._0_8_ = &PTR__typed_option_00306b28;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e30._M_dataplus._M_p != &local_e30.field_2) {
    operator_delete(local_e30._M_dataplus._M_p);
  }
  if (local_e10[0] != local_e00) {
    operator_delete(local_e10[0]);
  }
  if (local_df0[0] != local_de0) {
    operator_delete(local_df0[0]);
  }
  local_530._0_8_ = &PTR__typed_option_00306b28;
  if (local_498._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498._M_pi);
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dd0._M_dataplus._M_p != &local_dd0.field_2) {
    operator_delete(local_dd0._M_dataplus._M_p);
  }
  if (local_db0[0] != local_da0) {
    operator_delete(local_db0[0]);
  }
  local_2b0._0_8_ = &PTR__typed_option_00306b28;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d90._M_dataplus._M_p != &local_d90.field_2) {
    operator_delete(local_d90._M_dataplus._M_p);
  }
  if (local_d70[0] != local_d60) {
    operator_delete(local_d70[0]);
  }
  local_210._0_8_ = &PTR__typed_option_00306b28;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d50._M_dataplus._M_p != &local_d50.field_2) {
    operator_delete(local_d50._M_dataplus._M_p);
  }
  if (local_d30[0] != local_d20) {
    operator_delete(local_d30[0]);
  }
  local_170._0_8_ = &PTR__typed_option_003065b0;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d10._M_dataplus._M_p != &local_d10.field_2) {
    operator_delete(local_d10._M_dataplus._M_p);
  }
  if (local_cf0[0] != local_ce0) {
    operator_delete(local_cf0[0]);
  }
  if (local_cd0[0] != local_cc0) {
    operator_delete(local_cd0[0]);
  }
  local_490._0_8_ = &PTR__typed_option_00306b28;
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb0._M_dataplus._M_p != &local_cb0.field_2) {
    operator_delete(local_cb0._M_dataplus._M_p);
  }
  if (local_c90[0] != local_c80) {
    operator_delete(local_c90[0]);
  }
  local_d0._0_8_ = &PTR__typed_option_00306af0;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
    operator_delete(local_c70._M_dataplus._M_p);
  }
  if (local_c50[0] != local_c40) {
    operator_delete(local_c50[0]);
  }
  local_7b0._0_8_ = &PTR__typed_option_00306af0;
  if (local_718._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_718._M_pi);
  }
  if (local_728._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_728._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_7b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
    operator_delete(local_c30._M_dataplus._M_p);
  }
  if (local_c10[0] != local_c00) {
    operator_delete(local_c10[0]);
  }
  local_710._0_8_ = &PTR__typed_option_00308ee8;
  if (local_678._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_678._M_pi);
  }
  if (local_688._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_688._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_710);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
    operator_delete(local_bf0._M_dataplus._M_p);
  }
  if (local_bd0[0] != local_bc0) {
    operator_delete(local_bd0[0]);
  }
  local_670._0_8_ = &PTR__typed_option_00308ee8;
  if (local_5d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5d8._M_pi);
  }
  if (local_5e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_670);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
    operator_delete(local_bb0._M_dataplus._M_p);
  }
  if (local_b90[0] != local_b80) {
    operator_delete(local_b90[0]);
  }
  local_5d0._0_8_ = &PTR__typed_option_00306b28;
  if (local_538._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_538._M_pi);
  }
  if (local_548._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_548._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
    operator_delete(local_b70._M_dataplus._M_p);
  }
  if (local_b50[0] != local_b40) {
    operator_delete(local_b50[0]);
  }
  local_9f8._0_8_ = &PTR__typed_option_00306b28;
  if (local_960._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_960._M_pi);
  }
  if (local_970._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_970._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_9f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
    operator_delete(local_b30._M_dataplus._M_p);
  }
  if (local_b10[0] != local_b00) {
    operator_delete(local_b10[0]);
  }
  if (local_af0[0] != local_ae0) {
    operator_delete(local_af0[0]);
  }
  local_958._0_8_ = &PTR__typed_option_00306af0;
  if (local_8c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8c0._M_pi);
  }
  if (local_8d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8d0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_958);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
    operator_delete(local_ad0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_a90);
  this = (options_boost_po *)
         __dynamic_cast(options,&VW::config::options_i::typeinfo,
                        &VW::config::options_boost_po::typeinfo);
  if (this != (options_boost_po *)0x0) {
    local_958._8_8_ = (string *)0x0;
    local_948[0] = '\0';
    local_9f8._0_8_ = local_9f8 + 0x10;
    local_958._0_8_ = local_948;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"data","");
    bVar4 = VW::config::options_boost_po::try_get_positional_option_token
                      (this,(string *)local_9f8,(string *)local_958,-1);
    if ((undefined1 *)local_9f8._0_8_ != local_9f8 + 0x10) {
      operator_delete((void *)local_9f8._0_8_);
    }
    if (bVar4) {
      psVar1 = (string *)(all->data_filename)._M_string_length;
      if (psVar1 == (string *)local_958._8_8_) {
        if (psVar1 != (string *)0x0) {
          iVar6 = bcmp((location->_M_dataplus)._M_p,(void *)local_958._0_8_,(size_t)psVar1);
          if (iVar6 != 0) goto LAB_00165abe;
        }
      }
      else {
LAB_00165abe:
        std::__cxx11::string::_M_assign((string *)location);
      }
    }
    if ((undefined1 *)local_958._0_8_ != local_948) {
      operator_delete((void *)local_958._0_8_);
    }
  }
  bVar4 = __return_storage_ptr__->daemon;
  bVar9 = 1;
  if (bVar4 == false) {
    local_9f8._0_8_ = local_9f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"pid_file","");
    iVar6 = (*options->_vptr_options_i[1])(options,local_9f8);
    if ((char)iVar6 != '\0') goto LAB_00165b2e;
    local_5d0._0_8_ = local_5d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"port","");
    iVar6 = (*options->_vptr_options_i[1])(options,local_5d0);
    bVar3 = true;
    if ((char)iVar6 == '\0') {
      bVar9 = 0;
    }
    else {
      bVar9 = all->active ^ 1;
    }
  }
  else {
LAB_00165b2e:
    bVar3 = false;
  }
  if ((bVar3) && ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10)) {
    operator_delete((void *)local_5d0._0_8_);
  }
  if ((bVar4 == false) && ((undefined1 *)local_9f8._0_8_ != local_9f8 + 0x10)) {
    operator_delete((void *)local_9f8._0_8_);
  }
  if (bVar9 != 0) {
    all->daemon = true;
    all->numpasses = 100000;
  }
  if (*location_00 == true) {
    pcVar2 = (all->data_filename)._M_dataplus._M_p;
    local_958._0_8_ = local_948;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_958,pcVar2,pcVar2 + (all->data_filename)._M_string_length);
    std::__cxx11::string::append(local_958);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->cache_files,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_958);
    if ((undefined1 *)local_958._0_8_ != local_948) {
      operator_delete((void *)local_958._0_8_);
    }
  }
  if (__return_storage_ptr__->compressed == true) {
    set_compressed(all->p);
  }
  local_958._0_8_ = local_948;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_958,".gz","");
  psVar1 = (string *)(all->data_filename)._M_string_length;
  uVar8 = (long)psVar1 - local_958._8_8_;
  if (psVar1 < (ulong)local_958._8_8_ || uVar8 == 0) {
    bVar4 = false;
  }
  else {
    iVar6 = std::__cxx11::string::compare((ulong)location,uVar8,(string *)local_958._8_8_);
    bVar4 = iVar6 == 0;
  }
  if ((undefined1 *)local_958._0_8_ != local_948) {
    operator_delete((void *)local_958._0_8_);
  }
  if (bVar4) {
    set_compressed(all->p);
  }
  bVar4 = *location_00;
  if (bVar4 == false) {
    local_670._0_8_ = local_670 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"cache_file","");
    iVar6 = (*options->_vptr_options_i[1])(options,local_670);
    if ((char)iVar6 == '\0') {
      bVar9 = 1;
      bVar4 = false;
      cVar5 = '\0';
      goto LAB_00165d5c;
    }
  }
  bVar9 = bVar4 ^ 1;
  local_710._0_8_ = local_710 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"invert_hash","");
  iVar6 = (*options->_vptr_options_i[1])(options,local_710);
  cVar5 = (char)iVar6;
  bVar4 = true;
LAB_00165d5c:
  if ((bVar4) && ((undefined1 *)local_710._0_8_ != local_710 + 0x10)) {
    operator_delete((void *)local_710._0_8_);
  }
  if ((bVar9 != 0) && ((undefined1 *)local_670._0_8_ != local_670 + 0x10)) {
    operator_delete((void *)local_670._0_8_);
  }
  if (cVar5 == '\0') {
    bVar4 = all->holdout_set_off;
    if (bVar4 == false) {
      local_958._0_8_ = local_948;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_958,"output_feature_regularizer_binary","");
      iVar6 = (*options->_vptr_options_i[1])(options,local_958);
      if ((char)iVar6 == '\0') {
        local_7b0._0_8_ = local_7b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7b0,"output_feature_regularizer_text","");
        iVar6 = (*options->_vptr_options_i[1])(options,local_7b0);
        cVar5 = (char)iVar6;
        bVar3 = true;
      }
      else {
        cVar5 = '\x01';
        bVar3 = false;
      }
    }
    else {
      bVar3 = false;
      cVar5 = '\0';
    }
    if ((bVar3) && ((undefined1 *)local_7b0._0_8_ != local_7b0 + 0x10)) {
      operator_delete((void *)local_7b0._0_8_);
    }
    if ((bVar4 == false) && ((undefined1 *)local_958._0_8_ != local_948)) {
      operator_delete((void *)local_958._0_8_);
    }
    if (cVar5 != '\0') {
      all->holdout_set_off = true;
      pvVar10 = &all->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar10->super_ostream,
                 "Making holdout_set_off=true since output regularizer specified",0x3e);
      std::ios::widen((char)(pvVar10->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar10);
      std::ostream::put((char)pvVar10);
      std::ostream::flush();
    }
    std::
    vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
    ::~vector(&local_a90.m_options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a90.m_name._M_dataplus._M_p != &local_a90.m_name.field_2) {
      operator_delete(local_a90.m_name._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_958);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_948,
             "invert_hash is incompatible with a cache file.  Use it in single pass mode only.",0x50
            );
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
             ,0x1d8,&local_7d0);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

input_options parse_source(vw& all, options_i& options)
{
  input_options parsed_options;

  option_group_definition input_options("Input options");
  input_options.add(make_option("data", all.data_filename).short_name("d").help("Example set"))
      .add(make_option("daemon", parsed_options.daemon).help("persistent daemon mode on port 26542"))
      .add(make_option("foreground", parsed_options.foreground)
               .help("in persistent daemon mode, do not run in the background"))
      .add(make_option("port", parsed_options.port).help("port to listen on; use 0 to pick unused port"))
      .add(make_option("num_children", all.num_children).help("number of children for persistent daemon mode"))
      .add(make_option("pid_file", parsed_options.pid_file).help("Write pid file in persistent daemon mode"))
      .add(make_option("port_file", parsed_options.port_file).help("Write port used in persistent daemon mode"))
      .add(make_option("cache", parsed_options.cache).short_name("c").help("Use a cache.  The default is <data>.cache"))
      .add(make_option("cache_file", parsed_options.cache_files).help("The location(s) of cache_file."))
      .add(make_option("json", parsed_options.json).help("Enable JSON parsing."))
      .add(make_option("dsjson", parsed_options.dsjson).help("Enable Decision Service JSON parsing."))
      .add(make_option("kill_cache", parsed_options.kill_cache)
               .short_name("k")
               .help("do not reuse existing cache: create a new one always"))
      .add(
          make_option("compressed", parsed_options.compressed)
              .help(
                  "use gzip format whenever possible. If a cache file is being created, this option creates a "
                  "compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."))
      .add(make_option("no_stdin", all.stdin_off).help("do not default to reading from stdin"));

  options.add_and_parse(input_options);

  // If the option provider is program_options try and retrieve data as a positional parameter.
  options_i* options_ptr = &options;
  auto boost_options = dynamic_cast<options_boost_po*>(options_ptr);
  if (boost_options)
  {
    std::string data;
    if (boost_options->try_get_positional_option_token("data", data, -1))
    {
      if (all.data_filename != data)
      {
        all.data_filename = data;
      }
    }
  }

  if (parsed_options.daemon || options.was_supplied("pid_file") || (options.was_supplied("port") && !all.active))
  {
    all.daemon = true;
    // allow each child to process up to 1e5 connections
    all.numpasses = (size_t)1e5;
  }

  // Add an implicit cache file based on the data filename.
  if (parsed_options.cache)
  {
    parsed_options.cache_files.push_back(all.data_filename + ".cache");
  }

  if (parsed_options.compressed)
    set_compressed(all.p);

  if (ends_with(all.data_filename, ".gz"))
    set_compressed(all.p);

  if ((parsed_options.cache || options.was_supplied("cache_file")) && options.was_supplied("invert_hash"))
    THROW("invert_hash is incompatible with a cache file.  Use it in single pass mode only.");

  if (!all.holdout_set_off &&
      (options.was_supplied("output_feature_regularizer_binary") ||
          options.was_supplied("output_feature_regularizer_text")))
  {
    all.holdout_set_off = true;
    all.trace_message << "Making holdout_set_off=true since output regularizer specified" << endl;
  }

  return parsed_options;
}